

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O1

bool __thiscall Trie::insert(Trie *this,Unicode *_unicode)

{
  uint32_t uVar1;
  mapped_type ptVar2;
  _Rb_tree_header *p_Var3;
  mapped_type *pptVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ushort *puVar7;
  mapped_type ptVar8;
  bool bVar9;
  uint16_t index;
  undefined2 local_3a;
  Trie *local_38;
  
  ptVar8 = this->root;
  puVar7 = (_unicode->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar9 = puVar7 == (_unicode->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (!bVar9) {
    do {
      local_3a = *puVar7;
      p_Var3 = &(ptVar8->nextMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (ptVar8->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var3->_M_header;
      for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[bVar9]) {
        bVar9 = (ushort)(short)p_Var6[1]._M_color < (ushort)local_3a;
        if (!bVar9) {
          p_Var5 = p_Var6;
        }
      }
      p_Var6 = &p_Var3->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var3) &&
         (p_Var6 = p_Var5, (ushort)local_3a < (ushort)(short)p_Var5[1]._M_color)) {
        p_Var6 = &p_Var3->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 == p_Var3) {
        ptVar2 = (mapped_type)operator_new(0x40);
        p_Var3 = &(ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header;
        (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
        (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header
        ;
        (ptVar2->nextMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        ptVar2->search_clue = (trie_node_t *)0x0;
        ptVar2->infoIndex = -1;
        pptVar4 = std::
                  map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                  ::operator[](&ptVar8->nextMap,&local_3a);
        *pptVar4 = ptVar2;
      }
      pptVar4 = std::
                map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                ::operator[](&ptVar8->nextMap,&local_3a);
      ptVar8 = *pptVar4;
      puVar7 = puVar7 + 1;
      bVar9 = puVar7 == (_unicode->
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                        .super__Vector_impl_data._M_finish;
    } while (!bVar9);
  }
  uVar1 = local_38->size;
  local_38->size = uVar1 + 1;
  ptVar8->infoIndex = uVar1;
  return bVar9;
}

Assistant:

bool Trie::insert(Unicode &_unicode)
{
	trie_node_t *node = root;
	uint16_t index;
	auto iter = _unicode.begin();
	for ( ; iter != _unicode.end(); iter++ ) {
		index = *iter;
		if ( node->nextMap.find(index) == node->nextMap.end() ) {
			try {
				node->nextMap[index] = new trie_node_t;
			}
		    catch(const bad_alloc& ) {
				return false;
			}
		}
		node = node->nextMap[index];
	}
	node->infoIndex = size++;
	return true;
}